

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Matcher::Matcher(Matcher *this,ScriptContext *scriptContext,RegexPattern *pattern)

{
  ThreadContext *this_00;
  StandardChars<char16_t> *ptr;
  Type *this_01;
  Program **ppPVar1;
  Recycler *pRVar2;
  Program *pPVar3;
  GroupInfo *ptr_00;
  LoopInfo *ptr_01;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  nullptr_t local_38;
  nullptr_t local_30;
  nullptr_t local_28;
  RegexPattern *local_20;
  RegexPattern *pattern_local;
  ScriptContext *scriptContext_local;
  Matcher *this_local;
  
  local_20 = pattern;
  pattern_local = (RegexPattern *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierPtr(&this->pattern,pattern);
  this_00 = Js::ScriptContext::GetThreadContext((ScriptContext *)pattern_local);
  ptr = ThreadContext::GetStandardChars(this_00,(char16 *)0x0);
  Memory::WriteBarrierPtr<UnifiedRegex::StandardChars<char16_t>_>::WriteBarrierPtr
            (&this->standardChars,ptr);
  this_01 = &this->program;
  ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_Program__
                      ((WriteBarrierPtr *)&(local_20->rep).unified);
  Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::WriteBarrierPtr(this_01,*ppPVar1);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<UnifiedRegex::GroupInfo>::WriteBarrierPtr(&this->groupInfos,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<UnifiedRegex::LoopInfo>::WriteBarrierPtr(&this->loopInfos,&local_30);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierPtr
            (&this->literalNextSyncInputOffsets,&local_38);
  pRVar2 = Js::ScriptContext::GetRecycler((ScriptContext *)pattern_local);
  this->recycler = pRVar2;
  this->previousQcTime = 0;
  this->stats = (Type)0x0;
  this->w = (Type)0x0;
  pRVar2 = this->recycler;
  pPVar3 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(this_01);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&GroupInfo::typeinfo,0,(ulong)pPVar3->numGroups,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
             ,0x1344);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_60);
  pPVar3 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(this_01);
  local_70 = Memory::Recycler::AllocLeaf;
  local_68 = 0;
  ptr_00 = Memory::AllocateArray<Memory::Recycler,UnifiedRegex::GroupInfo,false>
                     ((Memory *)pRVar2,(Recycler *)Memory::Recycler::AllocLeaf,0,
                      (ulong)pPVar3->numGroups);
  Memory::WriteBarrierPtr<UnifiedRegex::GroupInfo>::operator=(&this->groupInfos,ptr_00);
  pPVar3 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
  if (0 < pPVar3->numLoops) {
    pRVar2 = this->recycler;
    pPVar3 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_98,(type_info *)&LoopInfo::typeinfo,0,(long)pPVar3->numLoops,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
               ,0x1348);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_98);
    pPVar3 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
    ptr_01 = Memory::AllocateArray<Memory::Recycler,UnifiedRegex::LoopInfo,false>
                       ((Memory *)pRVar2,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                        (long)pPVar3->numLoops);
    Memory::WriteBarrierPtr<UnifiedRegex::LoopInfo>::operator=(&this->loopInfos,ptr_01);
  }
  return;
}

Assistant:

Matcher::Matcher(Js::ScriptContext* scriptContext, RegexPattern* pattern)
        : pattern(pattern)
        , standardChars(scriptContext->GetThreadContext()->GetStandardChars((char16*)0))
        , program(pattern->rep.unified.program)
        , groupInfos(nullptr)
        , loopInfos(nullptr)
        , literalNextSyncInputOffsets(nullptr)
        , recycler(scriptContext->GetRecycler())
        , previousQcTime(0)
#if ENABLE_REGEX_CONFIG_OPTIONS
        , stats(0)
        , w(0)
#endif
    {
        // Don't need to zero out - the constructor for GroupInfo should take care of it
        groupInfos = RecyclerNewArrayLeaf(recycler, GroupInfo, program->numGroups);

        if (program->numLoops > 0)
        {
            loopInfos = RecyclerNewArrayLeafZ(recycler, LoopInfo, program->numLoops);
        }
    }